

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution_x86_avx::forward_int8_x86
          (Convolution_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  _func_int *p_Var2;
  Layer *pLVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined4 uVar11;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined1 uVar18;
  int iVar19;
  int i;
  uint uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  pointer piVar27;
  undefined1 *puVar28;
  pointer piVar29;
  long lVar30;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  void *pvVar34;
  long lVar35;
  long lVar36;
  undefined8 *puVar37;
  uint uVar38;
  ulong uVar40;
  int i_1;
  int i_3;
  int iVar41;
  long lVar42;
  undefined1 *puVar43;
  int iVar44;
  int outw;
  Convolution_x86_avx *pCVar45;
  void *pvVar46;
  int iVar47;
  ulong uVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [16];
  int w_1;
  int w;
  Option opt_q;
  void *local_1e8;
  allocator_type local_1d9;
  void *local_1d8;
  pointer local_1d0;
  void *local_1c8;
  Mat *local_1c0;
  pointer local_1b8;
  void *local_1b0;
  Convolution_x86_avx *local_1a8;
  ulong local_1a0;
  undefined1 *local_198;
  Mat *local_190;
  long local_188;
  Option *local_180;
  Mat local_178;
  void *local_130;
  undefined1 local_128 [32];
  undefined1 local_108 [32];
  size_t local_e8;
  Mat *local_e0;
  Mat local_d8;
  Mat *local_88;
  int local_80;
  int local_7c;
  Mat local_78;
  undefined4 uVar13;
  undefined3 uVar15;
  undefined2 uVar17;
  undefined1 *puVar39;
  
  local_78.elempack = bottom_blob->elempack;
  local_78.elemsize = bottom_blob->elemsize;
  piVar1 = bottom_blob->refcount;
  local_78.data = bottom_blob->data;
  local_78.refcount = bottom_blob->refcount;
  local_78.allocator = bottom_blob->allocator;
  local_78.dims = bottom_blob->dims;
  local_78.w = bottom_blob->w;
  local_78.h = bottom_blob->h;
  local_78.d = bottom_blob->d;
  local_78.c = bottom_blob->c;
  local_78.cstep = bottom_blob->cstep;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  if (local_78.elempack == 0 || ((int)local_78.elemsize * 8) / local_78.elempack != 8) {
    local_128._0_8_ = *(undefined8 *)opt;
    local_128._16_8_ = opt->workspace_allocator;
    uVar11 = opt->openmp_blocktime;
    uVar12 = opt->use_winograd_convolution;
    uVar14 = opt->use_sgemm_convolution;
    uVar16 = opt->use_int8_inference;
    uVar18 = opt->use_vulkan_compute;
    uVar17 = CONCAT11(uVar18,uVar16);
    uVar15 = CONCAT21(uVar17,uVar14);
    uVar13 = CONCAT31(uVar15,uVar12);
    local_108[0] = opt->use_bf16_storage;
    local_108[1] = opt->use_fp16_packed;
    local_108[2] = opt->use_fp16_storage;
    local_108[3] = opt->use_fp16_arithmetic;
    local_108[4] = opt->use_int8_packed;
    local_108[5] = opt->use_int8_storage;
    local_108[6] = opt->use_int8_arithmetic;
    local_108[7] = opt->use_packing_layout;
    local_108[8] = opt->use_shader_pack8;
    local_108[9] = opt->use_subgroup_basic;
    local_108[10] = opt->use_subgroup_vote;
    local_108[0xb] = opt->use_subgroup_ballot;
    local_108[0xc] = opt->use_subgroup_shuffle;
    local_108[0xd] = opt->use_image_storage;
    local_108[0xe] = opt->use_tensor_storage;
    local_108[0xf] = opt->use_reserved_0;
    local_108._16_4_ = opt->flush_denormals;
    local_108[0x14] = opt->use_local_pool_allocator;
    local_108[0x15] = opt->use_shader_local_memory;
    local_108[0x16] = opt->use_cooperative_matrix;
    local_108[0x17] = opt->use_winograd23_convolution;
    local_108[0x18] = opt->use_winograd43_convolution;
    local_108[0x19] = opt->use_winograd63_convolution;
    local_108[0x1a] = opt->use_a53_a55_optimized_kernel;
    local_108[0x1b] = opt->use_reserved_7;
    local_108[0x1c] = opt->use_reserved_8;
    local_108[0x1d] = opt->use_reserved_9;
    local_108[0x1e] = opt->use_reserved_10;
    local_108[0x1f] = opt->use_reserved_11;
    local_128._8_4_ = SUB84(opt->workspace_allocator,0);
    local_128._12_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_128._24_4_ = uVar11;
    local_128._28_4_ = uVar13;
    quantize_to_int8(bottom_blob,&local_78,
                     (Mat *)(&this->field_0x238 + (long)this->_vptr_Convolution_x86_avx[-3]),
                     (Option *)local_128);
  }
  local_178.cstep = 0;
  local_178.data = (void *)0x0;
  local_178.refcount._0_4_ = 0;
  local_178.refcount._4_4_ = 0;
  local_178.elemsize = 0;
  local_178.elempack = 0;
  local_178.allocator = (Allocator *)0x0;
  local_178.dims = 0;
  local_178.w = 0;
  local_178.h = 0;
  local_178.d = 0;
  local_178.c = 0;
  local_1a8 = this;
  Convolution::make_padding
            ((Convolution *)
             ((long)&this->_vptr_Convolution_x86_avx + (long)this->_vptr_Convolution_x86_avx[-3]),
             &local_78,&local_178,opt);
  iVar21 = -100;
  if ((local_178.data == (void *)0x0) || (local_178.cstep * (long)local_178.c == 0))
  goto LAB_00230a67;
  p_Var2 = local_1a8->_vptr_Convolution_x86_avx[-3];
  uVar31 = *(uint *)(p_Var2 + 0x28 + (long)&(local_1a8->weight_winograd23_data).data);
  iVar44 = (~((*(int *)(p_Var2 + 0x2c + (long)&(local_1a8->weight_winograd23_data).data) + -1) *
             *(int *)(p_Var2 + 0x34 + (long)&(local_1a8->weight_winograd23_data).data)) +
           local_178.w) / *(int *)(p_Var2 + 0x3c + (long)&(local_1a8->weight_winograd23_data).data)
           + 1;
  iVar41 = (~((*(int *)(p_Var2 + 0x30 + (long)&(local_1a8->weight_winograd23_data).data) + -1) *
             *(int *)(p_Var2 + 0x38 + (long)&(local_1a8->weight_winograd23_data).data)) +
           local_178.h) / *(int *)(p_Var2 + 0x40 + (long)&(local_1a8->weight_winograd23_data).data)
           + 1;
  local_7c = *(int *)(p_Var2 + 0x18 + (long)&(local_1a8->weight_winograd43_data).data);
  uVar32 = 1;
  if (opt->use_packing_layout == true) {
    if (local_7c < 0x65) {
      uVar32 = (uint)((uVar31 & 3) == 0) * 3 + 1;
    }
    else {
      uVar32 = 1;
      if ((uVar31 & 7) == 0) {
        uVar32 = 8;
      }
    }
  }
  local_1a0 = CONCAT44(local_1a0._4_4_,local_178.elempack);
  uVar20 = uVar32 * 4;
  if (100 < local_7c) {
    uVar20 = uVar32;
  }
  local_188 = (long)local_178.c;
  Mat::create(top_blob,iVar44,iVar41,(int)uVar31 / (int)uVar32,(ulong)uVar20,uVar32,
              opt->blob_allocator);
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_00230a67;
  local_190 = (Mat *)0x1;
  if (opt->use_packing_layout == true) {
    local_190 = (Mat *)(ulong)((uint)(((byte)(local_1a8->_vptr_Convolution_x86_avx[-3] + 0x28)
                                             [(long)&(local_1a8->weight_winograd23_data).data] & 3)
                                     == 0) * 3 + 1);
  }
  local_d8.cstep = 0;
  local_d8.data = (void *)0x0;
  local_d8.refcount._0_4_ = 0;
  local_d8.refcount._4_4_ = 0;
  local_d8.elemsize = 0;
  local_d8.elempack = 0;
  local_d8.allocator = (Allocator *)0x0;
  local_d8.dims = 0;
  local_d8.w = 0;
  local_d8.h = 0;
  local_d8.d = 0;
  local_d8.c = 0;
  iVar21 = (int)local_190;
  local_180 = opt;
  local_88 = top_blob;
  Mat::create(&local_d8,iVar44,iVar41,
              *(int *)(local_1a8->_vptr_Convolution_x86_avx[-3] + 0x28 +
                      (long)&(local_1a8->weight_winograd23_data).data) / iVar21,
              (ulong)(uint)(iVar21 * 4),iVar21,opt->workspace_allocator);
  iVar19 = local_d8.h;
  iVar44 = local_d8.w;
  iVar41 = local_178.c;
  iVar21 = -100;
  if ((local_d8.data != (void *)0x0) &&
     (local_1c0 = (Mat *)(long)local_d8.c, local_d8.cstep * (long)local_1c0 != 0)) {
    iVar21 = (int)local_190;
    pCVar45 = local_1a8;
    iVar47 = (int)local_1a0;
    if (((int)local_1a0 == 8) && (iVar21 == 4)) {
      p_Var2 = local_1a8->_vptr_Convolution_x86_avx[-3];
      uVar31 = *(uint *)(p_Var2 + 0x2c + (long)&(local_1a8->weight_winograd23_data).data);
      if (((ulong)uVar31 == 1) &&
         (*(int *)(p_Var2 + 0x30 + (long)&(local_1a8->weight_winograd23_data).data) == 1)) {
        if ((*(int *)(p_Var2 + 0x34 + (long)&(local_1a8->weight_winograd23_data).data) == 1) &&
           (((*(int *)(p_Var2 + 0x38 + (long)&(local_1a8->weight_winograd23_data).data) == 1 &&
             (*(int *)(p_Var2 + 0x3c + (long)&(local_1a8->weight_winograd23_data).data) == 1)) &&
            (*(int *)(p_Var2 + 0x40 + (long)&(local_1a8->weight_winograd23_data).data) == 1)))) {
          conv1x1s1_sgemm_pack8to4_int8_sse
                    (&local_178,&local_d8,&local_1a8->weight_sgemm_data,local_180);
        }
        else {
          if (((*(int *)(p_Var2 + 0x34 + (long)&(local_1a8->weight_winograd23_data).data) != 1) ||
              (*(int *)(p_Var2 + 0x38 + (long)&(local_1a8->weight_winograd23_data).data) != 1)) ||
             ((*(int *)(p_Var2 + 0x3c + (long)&(local_1a8->weight_winograd23_data).data) != 2 ||
              (*(int *)(p_Var2 + 0x40 + (long)&(local_1a8->weight_winograd23_data).data) != 2))))
          goto LAB_0022efb2;
          conv1x1s2_sgemm_pack8to4_int8_sse
                    (&local_178,&local_d8,&local_1a8->weight_sgemm_data,local_180);
        }
      }
      else {
LAB_0022efb2:
        if ((((local_180->use_winograd_convolution != true) || (uVar31 != 3)) ||
            (local_180->use_winograd43_convolution == false)) ||
           ((((*(int *)(p_Var2 + 0x30 + (long)&(local_1a8->weight_winograd23_data).data) != 3 ||
              (*(int *)(p_Var2 + 0x34 + (long)&(local_1a8->weight_winograd23_data).data) != 1)) ||
             (*(int *)(p_Var2 + 0x38 + (long)&(local_1a8->weight_winograd23_data).data) != 1)) ||
            ((*(int *)(p_Var2 + 0x3c + (long)&(local_1a8->weight_winograd23_data).data) != 1 ||
             (*(int *)(p_Var2 + 0x40 + (long)&(local_1a8->weight_winograd23_data).data) != 1)))))) {
          uVar32 = *(uint *)(p_Var2 + 0x30 + (long)&(local_1a8->weight_winograd23_data).data);
          local_198 = (undefined1 *)
                      (long)*(int *)(p_Var2 + 0x34 + (long)&(local_1a8->weight_winograd23_data).data
                                    );
          local_1c8 = (void *)(long)*(int *)(p_Var2 + 0x38 +
                                            (long)&(local_1a8->weight_winograd23_data).data);
          iVar21 = *(int *)(p_Var2 + 0x3c + (long)&(local_1a8->weight_winograd23_data).data);
          local_1b8 = (pointer)(long)*(int *)(p_Var2 + 0x40 +
                                             (long)&(local_1a8->weight_winograd23_data).data);
          local_1d0 = (pointer)CONCAT44(local_1d0._4_4_,local_178.w);
          uVar40 = (ulong)(uint)local_178.c;
          puVar43 = (undefined1 *)(ulong)(uint)local_d8.w;
          uVar33 = (ulong)(uint)local_d8.h;
          if (local_180->use_sgemm_convolution == true) {
            local_e8 = 0;
            local_128._0_8_ = (pointer)0x0;
            local_128._8_4_ = 0;
            local_128._12_4_ = 0;
            local_128._16_8_ = (Allocator *)0x0;
            local_128._24_4_ = 0;
            local_108._0_28_ = ZEXT1228((undefined1  [12])0x0);
            Mat::create((Mat *)local_128,local_d8.h * local_d8.w,uVar31 * uVar32,local_178.c,8,8,
                        local_180->workspace_allocator);
            local_1c0 = &local_1a8->weight_sgemm_data;
            if (0 < iVar41) {
              iVar41 = (int)local_1d0 * (int)local_1b8;
              local_1b0 = local_178.data;
              local_1b8 = (pointer)local_128._0_8_;
              local_1d8 = (void *)((long)local_178.w * (long)local_1c8);
              local_1e8 = (void *)0x0;
              do {
                if (0 < (int)uVar32) {
                  local_1d0 = (pointer)((long)local_178.data +
                                       local_178.cstep * (long)local_1e8 * local_178.elemsize);
                  piVar27 = (pointer)(local_128._0_8_ +
                                     local_e8 * (long)local_1e8 * local_128._16_8_);
                  local_1c8 = (void *)(local_178.elemsize * (long)local_1d8);
                  uVar33 = 0;
                  do {
                    if (0 < (int)uVar31) {
                      uVar26 = 0;
                      do {
                        if (0 < iVar19) {
                          puVar37 = (undefined8 *)
                                    ((long)local_1d0 +
                                    uVar26 * (long)local_198 * 8 + (long)local_1c8 * uVar33);
                          uVar20 = 0;
                          do {
                            puVar39 = puVar43;
                            if (0 < iVar44) {
                              do {
                                *(undefined8 *)piVar27 = *puVar37;
                                piVar27 = piVar27 + 2;
                                puVar37 = puVar37 + iVar21;
                                uVar38 = (int)puVar39 - 1;
                                puVar39 = (undefined1 *)(ulong)uVar38;
                              } while (uVar38 != 0);
                            }
                            puVar37 = puVar37 + (iVar41 - iVar44 * iVar21);
                            uVar20 = uVar20 + 1;
                          } while (uVar20 != iVar19);
                        }
                        uVar26 = uVar26 + 1;
                      } while (uVar26 != uVar31);
                    }
                    uVar33 = uVar33 + 1;
                  } while (uVar33 != uVar32);
                }
                local_1e8 = (void *)((long)local_1e8 + 1);
              } while (local_1e8 != (void *)uVar40);
            }
            im2col_sgemm_pack8to4_int8_sse((Mat *)local_128,&local_d8,local_1c0,local_180);
            pCVar45 = local_1a8;
            piVar1 = (int *)CONCAT44(local_128._12_4_,local_128._8_4_);
            iVar47 = (int)local_1a0;
            iVar21 = (int)local_190;
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                if ((Allocator *)local_108._0_8_ == (Allocator *)0x0) {
                  if ((pointer)local_128._0_8_ != (pointer)0x0) {
                    free((void *)local_128._0_8_);
                  }
                }
                else {
                  (*(*(_func_int ***)local_108._0_8_)[3])();
                }
              }
            }
          }
          else {
            uVar20 = uVar31 * uVar32;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)local_128,(long)(int)uVar20,&local_1d9);
            pCVar45 = local_1a8;
            if (0 < (int)uVar32) {
              iVar47 = 0;
              iVar22 = 0;
              uVar38 = 0;
              do {
                if (0 < (int)uVar31) {
                  lVar30 = 0;
                  do {
                    *(int *)(local_128._0_8_ + (iVar47 + lVar30) * 4) = iVar22;
                    iVar22 = iVar22 + (int)local_198;
                    lVar30 = lVar30 + 1;
                  } while (uVar31 != (uint)lVar30);
                  iVar47 = iVar47 + (uint)lVar30;
                }
                iVar22 = iVar22 + ((int)local_1d0 * (int)local_1c8 - (int)local_198 * uVar31);
                uVar38 = uVar38 + 1;
              } while (uVar38 != uVar32);
            }
            if (0 < (int)local_1c0) {
              local_1b0 = (void *)((long)iVar44 * 4);
              local_1e8 = (void *)0x0;
              do {
                if (0 < iVar19) {
                  local_1d0 = (pointer)(local_d8.cstep * (long)local_1e8 * local_d8.elemsize +
                                       (long)local_d8.data);
                  local_1d8 = (void *)0x0;
                  do {
                    if (0 < iVar44) {
                      local_1c8 = (void *)((long)local_1d8 * (long)local_1b8);
                      puVar39 = (undefined1 *)0x0;
                      do {
                        local_198 = puVar39;
                        if (iVar41 < 1) {
                          auVar57 = (undefined1  [16])0x0;
                          auVar50 = (undefined1  [16])0x0;
                          auVar54 = (undefined1  [16])0x0;
                          auVar49 = (undefined1  [16])0x0;
                        }
                        else {
                          pvVar34 = (void *)((local_1a8->weight_data_tm).cstep * (long)local_1e8 *
                                             (local_1a8->weight_data_tm).elemsize +
                                            (long)(local_1a8->weight_data_tm).data);
                          auVar51 = ZEXT1664((undefined1  [16])0x0);
                          uVar26 = 0;
                          auVar56 = ZEXT1664((undefined1  [16])0x0);
                          auVar55 = ZEXT1664((undefined1  [16])0x0);
                          auVar53 = ZEXT1664((undefined1  [16])0x0);
                          do {
                            if (0 < (int)uVar20) {
                              lVar30 = 0;
                              do {
                                auVar57._8_8_ = 0;
                                auVar57._0_8_ =
                                     *(ulong *)((long)local_178.data +
                                               (long)*(int *)(local_128._0_8_ + lVar30) * 8 +
                                               local_178.cstep * local_178.elemsize * uVar26 +
                                               (long)(iVar21 * 8 * (int)local_198) +
                                               (long)local_178.w * (long)local_1c8 *
                                               local_178.elemsize);
                                auVar49 = vpcmpgtb_avx((undefined1  [16])0x0,auVar57);
                                auVar10 = vpunpcklbw_avx(auVar57,auVar49);
                                auVar49 = *(undefined1 (*) [16])((long)pvVar34 + lVar30 * 8);
                                auVar57 = *(undefined1 (*) [16])((long)pvVar34 + lVar30 * 8 + 0x10);
                                auVar50 = vpcmpgtb_avx((undefined1  [16])0x0,auVar49);
                                auVar54 = vpcmpgtb_avx((undefined1  [16])0x0,auVar57);
                                auVar52 = vpunpcklbw_avx(auVar49,auVar50);
                                auVar49 = vpunpckhbw_avx(auVar49,auVar50);
                                auVar50 = vpunpcklbw_avx(auVar57,auVar54);
                                auVar57 = vpunpckhbw_avx(auVar57,auVar54);
                                auVar6 = vpmullw_avx(auVar52,auVar10);
                                auVar52 = vpmulhw_avx(auVar52,auVar10);
                                auVar7 = vpmullw_avx(auVar10,auVar49);
                                auVar4 = vpmulhw_avx(auVar10,auVar49);
                                auVar8 = vpmullw_avx(auVar50,auVar10);
                                auVar5 = vpmulhw_avx(auVar50,auVar10);
                                auVar9 = vpmullw_avx(auVar10,auVar57);
                                auVar10 = vpmulhw_avx(auVar10,auVar57);
                                auVar49 = vpunpcklwd_avx(auVar6,auVar52);
                                auVar49 = vpaddd_avx(auVar51._0_16_,auVar49);
                                auVar57 = vpunpcklwd_avx(auVar7,auVar4);
                                auVar57 = vpaddd_avx(auVar56._0_16_,auVar57);
                                auVar50 = vpunpcklwd_avx(auVar8,auVar5);
                                auVar50 = vpaddd_avx(auVar55._0_16_,auVar50);
                                auVar54 = vpunpcklwd_avx(auVar9,auVar10);
                                auVar54 = vpaddd_avx(auVar53._0_16_,auVar54);
                                auVar52 = vpunpckhwd_avx(auVar6,auVar52);
                                auVar49 = vpaddd_avx(auVar49,auVar52);
                                auVar51 = ZEXT1664(auVar49);
                                auVar49 = vpunpckhwd_avx(auVar7,auVar4);
                                auVar49 = vpaddd_avx(auVar57,auVar49);
                                auVar56 = ZEXT1664(auVar49);
                                auVar49 = vpunpckhwd_avx(auVar8,auVar5);
                                auVar49 = vpaddd_avx(auVar50,auVar49);
                                auVar55 = ZEXT1664(auVar49);
                                auVar49 = vpunpckhwd_avx(auVar9,auVar10);
                                auVar49 = vpaddd_avx(auVar54,auVar49);
                                auVar53 = ZEXT1664(auVar49);
                                lVar30 = lVar30 + 4;
                              } while ((ulong)uVar20 << 2 != lVar30);
                              pvVar34 = (void *)((long)pvVar34 + (ulong)uVar20 * 0x20);
                            }
                            auVar50 = auVar55._0_16_;
                            auVar57 = auVar53._0_16_;
                            auVar54 = auVar56._0_16_;
                            auVar49 = auVar51._0_16_;
                            uVar26 = uVar26 + 1;
                          } while (uVar26 != uVar40);
                        }
                        auVar52 = vpunpckldq_avx(auVar49,auVar54);
                        auVar4 = vpunpckldq_avx(auVar50,auVar57);
                        auVar54 = vpunpckhdq_avx(auVar49,auVar54);
                        auVar57 = vpunpckhdq_avx(auVar50,auVar57);
                        auVar50 = vpunpcklqdq_avx(auVar52,auVar4);
                        auVar49 = vpunpckhqdq_avx(auVar52,auVar4);
                        auVar49 = vpaddd_avx(auVar50,auVar49);
                        auVar50 = vpunpcklqdq_avx(auVar54,auVar57);
                        auVar57 = vpunpckhqdq_avx(auVar54,auVar57);
                        auVar57 = vpaddd_avx(auVar57,auVar50);
                        auVar49 = vpaddd_avx(auVar49,auVar57);
                        *(undefined1 (*) [16])(local_1d0 + (long)local_198 * 4) = auVar49;
                        puVar39 = local_198 + 1;
                      } while (local_198 + 1 != puVar43);
                    }
                    local_1d0 = local_1d0 + (long)iVar44 * 4;
                    local_1d8 = (void *)((long)local_1d8 + 1);
                  } while (local_1d8 != (void *)uVar33);
                }
                local_1e8 = (void *)((long)local_1e8 + 1);
              } while ((Mat *)local_1e8 != local_1c0);
            }
            iVar47 = (int)local_1a0;
            iVar21 = (int)local_190;
            if ((pointer)local_128._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
            }
          }
          goto LAB_0022f58e;
        }
        conv3x3s1_winograd43_pack8to4_int8_sse
                  (&local_178,&local_d8,&local_1a8->weight_winograd43_data,local_180);
      }
    }
    else {
LAB_0022f58e:
      iVar19 = local_d8.w;
      iVar44 = local_178.c;
      iVar41 = local_178.w;
      if ((iVar47 == 1) && (iVar21 == 4)) {
        p_Var2 = pCVar45->_vptr_Convolution_x86_avx[-3];
        uVar31 = *(uint *)(p_Var2 + 0x2c + (long)&(pCVar45->weight_winograd23_data).data);
        piVar27 = (pointer)(ulong)uVar31;
        if (piVar27 == (pointer)0x7) {
          if ((((*(int *)(p_Var2 + 0x30 + (long)&(pCVar45->weight_winograd23_data).data) != 7) ||
               (*(int *)(p_Var2 + 0x34 + (long)&(pCVar45->weight_winograd23_data).data) != 1)) ||
              (*(int *)(p_Var2 + 0x38 + (long)&(pCVar45->weight_winograd23_data).data) != 1)) ||
             ((*(int *)(p_Var2 + 0x3c + (long)&(pCVar45->weight_winograd23_data).data) != 2 ||
              (*(int *)(p_Var2 + 0x40 + (long)&(pCVar45->weight_winograd23_data).data) != 2))))
          goto LAB_0022f7a0;
          conv7x7s2_pack1to4_int8_sse(&local_178,&local_d8,&pCVar45->weight_sgemm_data,local_180);
        }
        else if (uVar31 == 3) {
          if (*(int *)(p_Var2 + 0x30 + (long)&(pCVar45->weight_winograd23_data).data) != 3)
          goto LAB_0022f7a0;
          if (((*(int *)(p_Var2 + 0x34 + (long)&(pCVar45->weight_winograd23_data).data) == 1) &&
              (*(int *)(p_Var2 + 0x38 + (long)&(pCVar45->weight_winograd23_data).data) == 1)) &&
             ((*(int *)(p_Var2 + 0x3c + (long)&(pCVar45->weight_winograd23_data).data) == 1 &&
              (*(int *)(p_Var2 + 0x40 + (long)&(pCVar45->weight_winograd23_data).data) == 1)))) {
            conv3x3s1_pack1to4_int8_sse(&local_178,&local_d8,&pCVar45->weight_sgemm_data,local_180);
          }
          else {
            if ((((*(int *)(p_Var2 + 0x34 + (long)&(pCVar45->weight_winograd23_data).data) != 1) ||
                 (*(int *)(p_Var2 + 0x38 + (long)&(pCVar45->weight_winograd23_data).data) != 1)) ||
                (*(int *)(p_Var2 + 0x3c + (long)&(pCVar45->weight_winograd23_data).data) != 2)) ||
               (*(int *)(p_Var2 + 0x40 + (long)&(pCVar45->weight_winograd23_data).data) != 2))
            goto LAB_0022f7a0;
            conv3x3s2_pack1to4_int8_sse(&local_178,&local_d8,&pCVar45->weight_sgemm_data,local_180);
          }
        }
        else {
          if ((uVar31 != 1) ||
             (*(int *)(p_Var2 + 0x30 + (long)&(pCVar45->weight_winograd23_data).data) != 1)) {
LAB_0022f7a0:
            local_1d8 = (void *)(ulong)*(uint *)(p_Var2 + 0x30 +
                                                (long)&(pCVar45->weight_winograd23_data).data);
            local_1c8 = (void *)(long)*(int *)(p_Var2 + 0x34 +
                                              (long)&(pCVar45->weight_winograd23_data).data);
            local_130 = (void *)(long)*(int *)(p_Var2 + 0x38 +
                                              (long)&(pCVar45->weight_winograd23_data).data);
            iVar21 = *(int *)(p_Var2 + 0x3c + (long)&(pCVar45->weight_winograd23_data).data);
            lVar42 = (long)iVar21;
            local_1b8 = (pointer)(long)*(int *)(p_Var2 + 0x40 +
                                               (long)&(pCVar45->weight_winograd23_data).data);
            puVar39 = (undefined1 *)(ulong)(uint)local_178.c;
            lVar30 = (long)local_d8.w;
            puVar43 = (undefined1 *)(ulong)(uint)local_d8.h;
            uVar31 = *(uint *)(p_Var2 + 0x30 + (long)&(pCVar45->weight_winograd23_data).data) *
                     uVar31;
            local_1d0 = piVar27;
            local_198 = puVar43;
            if (local_180->use_sgemm_convolution == true) {
              local_e8 = 0;
              local_128._0_8_ = (pointer)0x0;
              local_128._8_4_ = 0;
              local_128._12_4_ = 0;
              local_128._16_8_ = (Allocator *)0x0;
              local_128._24_4_ = 0;
              local_108._0_28_ = ZEXT1228((undefined1  [12])0x0);
              Mat::create((Mat *)local_128,local_d8.h * local_d8.w,uVar31,local_178.c,1,1,
                          local_180->workspace_allocator);
              local_e0 = &local_1a8->weight_sgemm_data;
              if (0 < iVar44) {
                iVar41 = iVar41 * (int)local_1b8;
                local_1c0 = (Mat *)0x0;
                do {
                  if (0 < (int)local_1d8) {
                    local_1b0 = (void *)((long)local_178.data +
                                        local_178.cstep * (long)local_1c0 * local_178.elemsize);
                    piVar27 = (pointer)(local_128._0_8_ +
                                       local_e8 * (long)local_1c0 * local_128._16_8_);
                    local_1b8 = (pointer)((long)local_178.w * local_178.elemsize * (long)local_130);
                    lVar30 = 0;
                    do {
                      if (0 < (int)local_1d0) {
                        lVar35 = 0;
                        do {
                          if (0 < (int)puVar43) {
                            puVar28 = (undefined1 *)
                                      ((long)local_1b0 +
                                      lVar35 * (long)local_1c8 + (long)local_1b8 * lVar30);
                            iVar44 = 0;
                            do {
                              if (iVar19 < 4) {
                                uVar31 = 0;
                              }
                              else {
                                iVar47 = 3;
                                do {
                                  *(undefined1 *)piVar27 = *puVar28;
                                  *(undefined1 *)((long)piVar27 + 1) = puVar28[lVar42];
                                  *(undefined1 *)((long)piVar27 + 2) = puVar28[iVar21 * 2];
                                  *(undefined1 *)((long)piVar27 + 3) = puVar28[iVar21 * 3];
                                  puVar28 = puVar28 + lVar42 * 4;
                                  piVar27 = piVar27 + 1;
                                  iVar47 = iVar47 + 4;
                                  uVar31 = iVar19 & 0xfffffffc;
                                } while (iVar47 < iVar19);
                              }
                              uVar32 = uVar31 | 1;
                              while ((int)uVar32 < iVar19) {
                                *(undefined1 *)piVar27 = *puVar28;
                                *(undefined1 *)((long)piVar27 + 1) = puVar28[lVar42];
                                puVar28 = puVar28 + iVar21 * 2;
                                piVar27 = (pointer)((long)piVar27 + 2);
                                uVar32 = uVar31 + 3;
                                uVar31 = uVar31 + 2;
                              }
                              if ((int)uVar31 < iVar19) {
                                iVar47 = iVar19 - uVar31;
                                do {
                                  *(undefined1 *)piVar27 = *puVar28;
                                  puVar28 = puVar28 + lVar42;
                                  piVar27 = (pointer)((long)piVar27 + 1);
                                  iVar47 = iVar47 + -1;
                                } while (iVar47 != 0);
                              }
                              puVar28 = puVar28 + (iVar41 - iVar19 * iVar21);
                              iVar44 = iVar44 + 1;
                              puVar43 = local_198;
                            } while (iVar44 != (int)local_198);
                          }
                          lVar35 = lVar35 + 1;
                        } while ((pointer)lVar35 != local_1d0);
                      }
                      lVar30 = lVar30 + 1;
                    } while ((void *)lVar30 != local_1d8);
                  }
                  local_1c0 = (Mat *)((long)&local_1c0->data + 1);
                } while (local_1c0 != (Mat *)puVar39);
              }
              im2col_sgemm_pack1to4_int8_sse((Mat *)local_128,&local_d8,local_e0,local_180);
              pCVar45 = local_1a8;
              piVar1 = (int *)CONCAT44(local_128._12_4_,local_128._8_4_);
              iVar47 = (int)local_1a0;
              iVar21 = (int)local_190;
              if (piVar1 != (int *)0x0) {
                LOCK();
                *piVar1 = *piVar1 + -1;
                UNLOCK();
                if (*piVar1 == 0) {
                  if ((Allocator *)local_108._0_8_ == (Allocator *)0x0) {
                    if ((pointer)local_128._0_8_ != (pointer)0x0) {
                      free((void *)local_128._0_8_);
                    }
                  }
                  else {
                    (*(*(_func_int ***)local_108._0_8_)[3])();
                  }
                }
              }
            }
            else {
              local_1c0 = (Mat *)(ulong)(uint)local_d8.c;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)local_128,(long)(int)uVar31,&local_1d9
                        );
              pCVar45 = local_1a8;
              if (0 < (int)local_1d8) {
                iVar23 = (int)local_1d0;
                iVar21 = 0;
                iVar47 = 0;
                iVar22 = 0;
                do {
                  if (0 < iVar23) {
                    lVar35 = 0;
                    do {
                      *(int *)(local_128._0_8_ + (iVar21 + lVar35) * 4) = iVar47;
                      iVar47 = iVar47 + (int)local_1c8;
                      lVar35 = lVar35 + 1;
                    } while (iVar23 != (int)lVar35);
                    iVar21 = iVar21 + (int)lVar35;
                  }
                  iVar47 = iVar47 + (iVar41 * (int)local_130 - (int)local_1c8 * iVar23);
                  iVar22 = iVar22 + 1;
                } while (iVar22 != (int)local_1d8);
              }
              if (0 < (int)local_1c0) {
                local_1b0 = (void *)(lVar30 * 4);
                local_1e8 = (void *)0x0;
                do {
                  if (0 < (int)puVar43) {
                    local_1d0 = (pointer)(local_d8.cstep * (long)local_1e8 * local_d8.elemsize +
                                         (long)local_d8.data);
                    local_1d8 = (void *)0x0;
                    do {
                      if (0 < iVar19) {
                        local_1c8 = (void *)((long)local_1d8 * (long)local_1b8);
                        lVar35 = 0;
                        do {
                          if (iVar44 < 1) {
                            auVar49 = (undefined1  [16])0x0;
                          }
                          else {
                            pvVar34 = (void *)((local_1a8->weight_data_tm).cstep * (long)local_1e8 *
                                               (local_1a8->weight_data_tm).elemsize +
                                              (long)(local_1a8->weight_data_tm).data);
                            auVar51 = ZEXT1664((undefined1  [16])0x0);
                            lVar36 = 0;
                            do {
                              if (0 < (int)uVar31) {
                                uVar40 = 0;
                                do {
                                  auVar49 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)
                                                  local_178.data +
                                                  (long)*(int *)(local_128._0_8_ + uVar40 * 4) +
                                                  local_178.cstep * local_178.elemsize * lVar36 +
                                                  lVar35 * lVar42 +
                                                  (long)local_178.w * (long)local_1c8 *
                                                  local_178.elemsize)),0);
                                  auVar50 = vpshufd_avx(auVar49,0);
                                  auVar54._8_8_ = 0;
                                  auVar54._0_8_ = *(ulong *)((long)pvVar34 + uVar40 * 4);
                                  auVar49 = vpcmpgtb_avx((undefined1  [16])0x0,auVar54);
                                  auVar49 = vpunpcklbw_avx(auVar54,auVar49);
                                  auVar57 = vpmullw_avx(auVar50,auVar49);
                                  auVar49 = vpmulhw_avx(auVar50,auVar49);
                                  auVar49 = vpunpcklwd_avx(auVar57,auVar49);
                                  auVar49 = vpaddd_avx(auVar51._0_16_,auVar49);
                                  auVar51 = ZEXT1664(auVar49);
                                  uVar40 = uVar40 + 1;
                                } while (uVar31 != uVar40);
                                pvVar34 = (void *)((long)pvVar34 + (ulong)uVar31 * 4);
                              }
                              auVar49 = auVar51._0_16_;
                              lVar36 = lVar36 + 1;
                            } while ((undefined1 *)lVar36 != puVar39);
                          }
                          *(undefined1 (*) [16])(local_1d0 + lVar35 * 4) = auVar49;
                          lVar35 = lVar35 + 1;
                        } while (lVar35 != lVar30);
                      }
                      local_1d0 = local_1d0 + lVar30 * 4;
                      local_1d8 = (void *)((long)local_1d8 + 1);
                      puVar43 = local_198;
                    } while ((undefined1 *)local_1d8 != local_198);
                  }
                  local_1e8 = (void *)((long)local_1e8 + 1);
                } while ((Mat *)local_1e8 != local_1c0);
              }
              iVar47 = (int)local_1a0;
              iVar21 = (int)local_190;
              if ((pointer)local_128._0_8_ != (pointer)0x0) {
                operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
              }
            }
            goto LAB_0022fcf1;
          }
          if (((*(int *)(p_Var2 + 0x34 + (long)&(pCVar45->weight_winograd23_data).data) == 1) &&
              ((*(int *)(p_Var2 + 0x38 + (long)&(pCVar45->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var2 + 0x3c + (long)&(pCVar45->weight_winograd23_data).data) == 1)))) &&
             (*(int *)(p_Var2 + 0x40 + (long)&(pCVar45->weight_winograd23_data).data) == 1)) {
            conv1x1s1_sgemm_pack1to4_int8_sse
                      (&local_178,&local_d8,&pCVar45->weight_sgemm_data,local_180);
          }
          else {
            if ((((*(int *)(p_Var2 + 0x34 + (long)&(pCVar45->weight_winograd23_data).data) != 1) ||
                 (*(int *)(p_Var2 + 0x38 + (long)&(pCVar45->weight_winograd23_data).data) != 1)) ||
                (*(int *)(p_Var2 + 0x3c + (long)&(pCVar45->weight_winograd23_data).data) != 2)) ||
               (*(int *)(p_Var2 + 0x40 + (long)&(pCVar45->weight_winograd23_data).data) != 2))
            goto LAB_0022f7a0;
            conv1x1s2_sgemm_pack1to4_int8_sse
                      (&local_178,&local_d8,&pCVar45->weight_sgemm_data,local_180);
          }
        }
      }
      else {
LAB_0022fcf1:
        iVar19 = local_d8.w;
        iVar44 = local_178.c;
        iVar41 = local_178.w;
        if ((iVar47 == 8) && (iVar21 == 1)) {
          p_Var2 = pCVar45->_vptr_Convolution_x86_avx[-3];
          uVar31 = *(uint *)(p_Var2 + 0x2c + (long)&(pCVar45->weight_winograd23_data).data);
          if (((ulong)uVar31 == 1) &&
             (*(int *)(p_Var2 + 0x30 + (long)&(pCVar45->weight_winograd23_data).data) == 1)) {
            if ((*(int *)(p_Var2 + 0x34 + (long)&(pCVar45->weight_winograd23_data).data) == 1) &&
               (((*(int *)(p_Var2 + 0x38 + (long)&(pCVar45->weight_winograd23_data).data) == 1 &&
                 (*(int *)(p_Var2 + 0x3c + (long)&(pCVar45->weight_winograd23_data).data) == 1)) &&
                (*(int *)(p_Var2 + 0x40 + (long)&(pCVar45->weight_winograd23_data).data) == 1)))) {
              conv1x1s1_sgemm_pack8to1_int8_sse
                        (&local_178,&local_d8,&pCVar45->weight_sgemm_data,local_180);
            }
            else {
              if ((((*(int *)(p_Var2 + 0x34 + (long)&(pCVar45->weight_winograd23_data).data) != 1)
                   || (*(int *)(p_Var2 + 0x38 + (long)&(pCVar45->weight_winograd23_data).data) != 1)
                   ) || (*(int *)(p_Var2 + 0x3c + (long)&(pCVar45->weight_winograd23_data).data) !=
                         2)) ||
                 (*(int *)(p_Var2 + 0x40 + (long)&(pCVar45->weight_winograd23_data).data) != 2))
              goto LAB_0022fe6e;
              conv1x1s2_sgemm_pack8to1_int8_sse
                        (&local_178,&local_d8,&pCVar45->weight_sgemm_data,local_180);
            }
          }
          else {
LAB_0022fe6e:
            if (((local_180->use_winograd_convolution == true) && (uVar31 == 3)) &&
               ((local_180->use_winograd43_convolution != false &&
                ((((*(int *)(p_Var2 + 0x30 + (long)&(pCVar45->weight_winograd23_data).data) == 3 &&
                   (*(int *)(p_Var2 + 0x34 + (long)&(pCVar45->weight_winograd23_data).data) == 1))
                  && (*(int *)(p_Var2 + 0x38 + (long)&(pCVar45->weight_winograd23_data).data) == 1))
                 && ((*(int *)(p_Var2 + 0x3c + (long)&(pCVar45->weight_winograd23_data).data) == 1
                     && (*(int *)(p_Var2 + 0x40 + (long)&(pCVar45->weight_winograd23_data).data) ==
                         1)))))))) {
              conv3x3s1_winograd43_pack8to1_int8_sse
                        (&local_178,&local_d8,&pCVar45->weight_winograd43_data,local_180);
            }
            else {
              local_1c8 = (void *)(ulong)*(uint *)(p_Var2 + 0x30 +
                                                  (long)&(pCVar45->weight_winograd23_data).data);
              local_1d0 = (pointer)(long)*(int *)(p_Var2 + 0x34 +
                                                 (long)&(pCVar45->weight_winograd23_data).data);
              iVar21 = *(int *)(p_Var2 + 0x38 + (long)&(pCVar45->weight_winograd23_data).data);
              iVar47 = *(int *)(p_Var2 + 0x3c + (long)&(pCVar45->weight_winograd23_data).data);
              local_1a0 = (ulong)*(int *)(p_Var2 + 0x40 +
                                         (long)&(pCVar45->weight_winograd23_data).data);
              uVar40 = (ulong)(uint)local_178.c;
              uVar33 = (ulong)(uint)local_d8.w;
              local_198 = (undefined1 *)(ulong)(uint)local_d8.h;
              uVar32 = *(uint *)(p_Var2 + 0x30 + (long)&(pCVar45->weight_winograd23_data).data) *
                       uVar31;
              if (local_180->use_sgemm_convolution == true) {
                local_e8 = 0;
                local_128._0_8_ = (pointer)0x0;
                local_128._8_4_ = 0;
                local_128._12_4_ = 0;
                local_128._16_8_ = (Allocator *)0x0;
                local_128._24_4_ = 0;
                local_108._0_28_ = ZEXT1228((undefined1  [12])0x0);
                Mat::create((Mat *)local_128,local_d8.h * local_d8.w,uVar32,local_178.c,8,8,
                            local_180->workspace_allocator);
                local_1c0 = &local_1a8->weight_sgemm_data;
                if (0 < iVar44) {
                  local_1b0 = local_178.data;
                  local_1b8 = (pointer)local_128._0_8_;
                  local_1d8 = (void *)((long)local_178.w * (long)iVar21);
                  local_1e8 = (void *)0x0;
                  do {
                    if (0 < (int)local_1c8) {
                      piVar27 = (pointer)(local_128._0_8_ +
                                         local_e8 * (long)local_1e8 * local_128._16_8_);
                      pvVar34 = (void *)0x0;
                      do {
                        if (0 < (int)uVar31) {
                          uVar26 = 0;
                          do {
                            if (0 < (int)local_198) {
                              puVar37 = (undefined8 *)
                                        ((long)local_178.data +
                                        uVar26 * (long)local_1d0 * 8 +
                                        local_178.elemsize * (long)local_1d8 * (long)pvVar34 +
                                        local_178.cstep * (long)local_1e8 * local_178.elemsize);
                              iVar21 = 0;
                              do {
                                uVar24 = uVar33;
                                if (0 < iVar19) {
                                  do {
                                    *(undefined8 *)piVar27 = *puVar37;
                                    piVar27 = piVar27 + 2;
                                    puVar37 = puVar37 + iVar47;
                                    uVar32 = (int)uVar24 - 1;
                                    uVar24 = (ulong)uVar32;
                                  } while (uVar32 != 0);
                                }
                                puVar37 = puVar37 + (iVar41 * (int)local_1a0 - iVar19 * iVar47);
                                iVar21 = iVar21 + 1;
                              } while (iVar21 != (int)local_198);
                            }
                            uVar26 = uVar26 + 1;
                          } while (uVar26 != uVar31);
                        }
                        pvVar34 = (void *)((long)pvVar34 + 1);
                      } while (pvVar34 != local_1c8);
                    }
                    local_1e8 = (void *)((long)local_1e8 + 1);
                  } while (local_1e8 != (void *)uVar40);
                }
                im2col_sgemm_pack8to1_int8_sse((Mat *)local_128,&local_d8,local_1c0,local_180);
                piVar1 = (int *)CONCAT44(local_128._12_4_,local_128._8_4_);
                if (piVar1 != (int *)0x0) {
                  LOCK();
                  *piVar1 = *piVar1 + -1;
                  UNLOCK();
                  if (*piVar1 == 0) {
                    if ((Allocator *)local_108._0_8_ == (Allocator *)0x0) {
LAB_00230af3:
                      if ((pointer)local_128._0_8_ != (pointer)0x0) {
                        free((void *)local_128._0_8_);
                      }
                    }
                    else {
                      (*(*(_func_int ***)local_108._0_8_)[3])();
                    }
                  }
                }
              }
              else {
                local_190 = (Mat *)(ulong)(uint)local_d8.c;
                std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)local_128,(long)(int)uVar32,
                           &local_1d9);
                if (0 < (int)local_1c8) {
                  iVar22 = 0;
                  iVar23 = 0;
                  iVar25 = 0;
                  do {
                    if (0 < (int)uVar31) {
                      lVar30 = 0;
                      do {
                        *(int *)(local_128._0_8_ + (iVar22 + lVar30) * 4) = iVar23;
                        iVar23 = iVar23 + (int)local_1d0;
                        lVar30 = lVar30 + 1;
                      } while (uVar31 != (uint)lVar30);
                      iVar22 = iVar22 + (uint)lVar30;
                    }
                    iVar23 = iVar23 + (iVar41 * iVar21 - (int)local_1d0 * uVar31);
                    iVar25 = iVar25 + 1;
                  } while (iVar25 != (int)local_1c8);
                }
                if (0 < (int)local_190) {
                  local_1c0 = (Mat *)(long)iVar19;
                  local_130 = local_d8.data;
                  local_e0 = (Mat *)(local_d8.elemsize * local_d8.cstep);
                  local_1d0 = (pointer)((ulong)uVar32 * 8);
                  local_188 = 0;
                  do {
                    if (0 < (int)local_198) {
                      local_1c8 = (void *)((long)local_e0 * local_188 + (long)local_d8.data);
                      local_1b0 = (void *)((local_1a8->weight_data_tm).cstep * local_188 *
                                           (local_1a8->weight_data_tm).elemsize +
                                          (long)(local_1a8->weight_data_tm).data);
                      local_1b8 = (pointer)0x0;
                      do {
                        if (0 < iVar19) {
                          local_1d8 = (void *)((long)local_1b8 * local_1a0 * local_178.elemsize);
                          uVar26 = 0;
                          do {
                            if (iVar44 < 1) {
                              iVar21 = 0;
                            }
                            else {
                              uVar24 = 0;
                              iVar21 = 0;
                              pvVar34 = local_1b0;
                              do {
                                if (0 < (int)uVar32) {
                                  uVar48 = 0;
                                  do {
                                    auVar50._8_8_ = 0;
                                    auVar50._0_8_ =
                                         *(ulong *)((long)local_178.data +
                                                   (long)*(int *)(local_128._0_8_ + uVar48 * 4) * 8
                                                   + local_178.cstep * local_178.elemsize * uVar24 +
                                                     (long)local_178.w * (long)local_1d8 +
                                                     (long)(iVar47 * 8 * (int)uVar26));
                                    auVar49 = vpcmpgtb_avx((undefined1  [16])0x0,auVar50);
                                    auVar50 = vpunpcklbw_avx(auVar50,auVar49);
                                    auVar52._8_8_ = 0;
                                    auVar52._0_8_ = *(ulong *)((long)pvVar34 + uVar48 * 8);
                                    auVar49 = vpcmpgtb_avx((undefined1  [16])0x0,auVar52);
                                    auVar49 = vpunpcklbw_avx(auVar52,auVar49);
                                    auVar57 = vpmullw_avx(auVar49,auVar50);
                                    auVar49 = vpmulhw_avx(auVar50,auVar49);
                                    auVar50 = vpunpcklwd_avx(auVar57,auVar49);
                                    auVar49 = vpunpckhwd_avx(auVar57,auVar49);
                                    auVar49 = vpaddd_avx(auVar50,auVar49);
                                    auVar49 = vphaddd_avx(auVar49,auVar49);
                                    auVar49 = vphaddd_avx(auVar49,auVar49);
                                    iVar21 = iVar21 + auVar49._0_4_;
                                    uVar48 = uVar48 + 1;
                                  } while (uVar32 != uVar48);
                                  pvVar34 = (void *)((long)local_1d0 + (long)pvVar34);
                                }
                                uVar24 = uVar24 + 1;
                              } while (uVar24 != uVar40);
                            }
                            *(int *)((long)local_1c8 + uVar26 * 4) = iVar21;
                            uVar26 = uVar26 + 1;
                          } while (uVar26 != uVar33);
                        }
                        local_1c8 = (void *)((long)local_1c8 + (long)local_1c0 * 4);
                        local_1b8 = (pointer)((long)local_1b8 + 1);
                      } while (local_1b8 != (pointer)local_198);
                    }
                    local_188 = local_188 + 1;
                  } while ((Mat *)local_188 != local_190);
                }
LAB_0023096c:
                if ((pointer)local_128._0_8_ != (pointer)0x0) {
                  operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
                }
              }
            }
          }
        }
        else if (iVar47 == 1 && iVar21 == 1) {
          p_Var2 = local_1a8->_vptr_Convolution_x86_avx[-3];
          uVar31 = *(uint *)(p_Var2 + 0x2c + (long)&(local_1a8->weight_winograd23_data).data);
          pvVar34 = (void *)(ulong)uVar31;
          if ((pvVar34 == (void *)0x1) &&
             (*(int *)(p_Var2 + 0x30 + (long)&(local_1a8->weight_winograd23_data).data) == 1)) {
            if ((*(int *)(p_Var2 + 0x34 + (long)&(local_1a8->weight_winograd23_data).data) == 1) &&
               (((*(int *)(p_Var2 + 0x38 + (long)&(local_1a8->weight_winograd23_data).data) == 1 &&
                 (*(int *)(p_Var2 + 0x3c + (long)&(local_1a8->weight_winograd23_data).data) == 1))
                && (*(int *)(p_Var2 + 0x40 + (long)&(local_1a8->weight_winograd23_data).data) == 1))
               )) {
              conv1x1s1_sgemm_int8_sse(&local_178,&local_d8,&local_1a8->weight_sgemm_data,local_180)
              ;
            }
            else {
              if ((((*(int *)(p_Var2 + 0x34 + (long)&(local_1a8->weight_winograd23_data).data) != 1)
                   || (*(int *)(p_Var2 + 0x38 + (long)&(local_1a8->weight_winograd23_data).data) !=
                       1)) ||
                  (*(int *)(p_Var2 + 0x3c + (long)&(local_1a8->weight_winograd23_data).data) != 2))
                 || (*(int *)(p_Var2 + 0x40 + (long)&(local_1a8->weight_winograd23_data).data) != 2)
                 ) goto LAB_002303cd;
              conv1x1s2_sgemm_int8_sse(&local_178,&local_d8,&local_1a8->weight_sgemm_data,local_180)
              ;
            }
          }
          else {
LAB_002303cd:
            if ((((local_180->use_winograd_convolution == true) && (uVar31 == 3)) &&
                ((local_180->use_winograd23_convolution != false &&
                 (((*(int *)(p_Var2 + 0x30 + (long)&(local_1a8->weight_winograd23_data).data) == 3
                   && (*(int *)(p_Var2 + 0x34 + (long)&(local_1a8->weight_winograd23_data).data) ==
                       1)) &&
                  (*(int *)(p_Var2 + 0x38 + (long)&(local_1a8->weight_winograd23_data).data) == 1)))
                 ))) && ((*(int *)(p_Var2 + 0x3c + (long)&(local_1a8->weight_winograd23_data).data)
                          == 1 && (*(int *)(p_Var2 + 0x40 +
                                           (long)&(local_1a8->weight_winograd23_data).data) == 1))))
            {
              if ((0xf < (int)local_1a0 * (int)local_188) &&
                 (0xf < *(int *)(p_Var2 + 0x28 + (long)&(local_1a8->weight_winograd23_data).data)))
              {
                conv3x3s1_winograd23_int8_sse
                          (&local_178,&local_d8,&local_1a8->weight_winograd23_data,local_180);
                goto LAB_00230981;
              }
            }
            local_1b0 = (void *)(ulong)*(uint *)(p_Var2 + 0x30 +
                                                (long)&(local_1a8->weight_winograd23_data).data);
            iVar21 = *(int *)(p_Var2 + 0x34 + (long)&(local_1a8->weight_winograd23_data).data);
            local_188 = (long)*(int *)(p_Var2 + 0x38 +
                                      (long)&(local_1a8->weight_winograd23_data).data);
            iVar41 = *(int *)(p_Var2 + 0x3c + (long)&(local_1a8->weight_winograd23_data).data);
            lVar30 = (long)iVar41;
            local_1a0 = (ulong)*(int *)(p_Var2 + 0x40 +
                                       (long)&(local_1a8->weight_winograd23_data).data);
            local_1d8 = (void *)CONCAT44(local_1d8._4_4_,local_178.w);
            uVar40 = (ulong)(uint)local_178.c;
            pvVar46 = (void *)(long)local_d8.w;
            puVar43 = (undefined1 *)(ulong)(uint)local_d8.h;
            uVar32 = *(uint *)(p_Var2 + 0x30 + (long)&(local_1a8->weight_winograd23_data).data) *
                     uVar31;
            local_198 = puVar43;
            if (local_180->use_sgemm_convolution != true) {
              local_190 = (Mat *)(ulong)(uint)local_d8.c;
              local_1d0 = (pointer)(long)(int)uVar32;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)local_128,(size_type)local_1d0,
                         &local_1d9);
              if (0 < (int)local_1b0) {
                iVar41 = 0;
                iVar47 = 0;
                iVar22 = 0;
                do {
                  if (0 < (int)uVar31) {
                    lVar42 = 0;
                    do {
                      *(int *)(local_128._0_8_ + (iVar41 + lVar42) * 4) = iVar22;
                      iVar22 = iVar22 + iVar21;
                      lVar42 = lVar42 + 1;
                    } while (uVar31 != (uint)lVar42);
                    iVar41 = iVar41 + (uint)lVar42;
                  }
                  iVar22 = iVar22 + ((int)local_1d8 * (int)local_188 - iVar21 * uVar31);
                  iVar47 = iVar47 + 1;
                } while (iVar47 != (int)local_1b0);
              }
              if (0 < (int)local_190) {
                local_130 = local_d8.data;
                local_e0 = (Mat *)(local_d8.elemsize * local_d8.cstep);
                local_80 = iVar44 * uVar32;
                local_188 = 0;
                do {
                  if (0 < (int)puVar43) {
                    local_1e8 = (void *)((long)local_e0 * local_188 + (long)local_d8.data);
                    local_1b8 = (pointer)((long)(local_80 * (int)local_188) +
                                         (long)(local_1a8->weight_data_tm).data);
                    local_1c0 = (Mat *)0x0;
                    do {
                      if (0 < iVar19) {
                        local_1d8 = local_178.data;
                        local_1b0 = (void *)((long)local_1c0 * local_1a0 * local_178.elemsize);
                        pvVar34 = (void *)0x0;
                        do {
                          local_1c8 = pvVar34;
                          if (iVar44 < 1) {
                            iVar21 = 0;
                          }
                          else {
                            uVar33 = 0;
                            iVar21 = 0;
                            piVar27 = local_1b8;
                            do {
                              if (0 < (int)uVar32) {
                                uVar26 = 0;
                                do {
                                  iVar21 = iVar21 + (int)*(char *)((long)piVar27 + uVar26) *
                                                    (int)*(char *)((long)local_178.data +
                                                                  (long)*(int *)(local_128._0_8_ +
                                                                                uVar26 * 4) +
                                                                  local_178.cstep *
                                                                  local_178.elemsize * uVar33 +
                                                                  (long)local_178.w *
                                                                  (long)local_1b0 +
                                                                  (long)local_1c8 * lVar30);
                                  uVar26 = uVar26 + 1;
                                } while (uVar32 != uVar26);
                              }
                              piVar27 = (pointer)((long)local_1d0 + (long)piVar27);
                              uVar33 = uVar33 + 1;
                            } while (uVar33 != uVar40);
                          }
                          *(int *)((long)local_1e8 + (long)local_1c8 * 4) = iVar21;
                          pvVar34 = (void *)((long)local_1c8 + 1U);
                        } while ((void *)((long)local_1c8 + 1U) != pvVar46);
                      }
                      local_1e8 = (void *)((long)local_1e8 + (long)pvVar46 * 4);
                      local_1c0 = (Mat *)((long)&local_1c0->data + 1);
                      puVar43 = local_198;
                    } while (local_1c0 != (Mat *)local_198);
                  }
                  local_188 = local_188 + 1;
                } while ((Mat *)local_188 != local_190);
              }
              goto LAB_0023096c;
            }
            local_e8 = 0;
            local_128._0_8_ = (pointer)0x0;
            local_128._8_4_ = 0;
            local_128._12_4_ = 0;
            local_128._16_8_ = (Allocator *)0x0;
            local_128._24_4_ = 0;
            local_108._0_28_ = ZEXT1228((undefined1  [12])0x0);
            Mat::create((Mat *)local_128,local_d8.h * local_d8.w,uVar32,local_178.c,1,1,
                        local_180->workspace_allocator);
            local_190 = &local_1a8->weight_sgemm_data;
            if (0 < iVar44) {
              iVar44 = (int)local_1d8 * (int)local_1a0;
              local_1a0 = 0;
              do {
                if (0 < (int)local_1b0) {
                  local_1b8 = (pointer)((long)local_178.data +
                                       local_178.cstep * local_1a0 * local_178.elemsize);
                  piVar27 = (pointer)(local_128._0_8_ + local_e8 * local_1a0 * local_128._16_8_);
                  local_1c0 = (Mat *)((long)local_178.w * local_178.elemsize * local_188);
                  pvVar46 = (void *)0x0;
                  do {
                    local_1d8 = pvVar46;
                    if (0 < (int)uVar31) {
                      local_1d0 = (pointer)((long)local_1b8 + (long)local_1c0 * (long)local_1d8);
                      pvVar46 = (void *)0x0;
                      do {
                        if (0 < (int)puVar43) {
                          piVar29 = (pointer)((long)local_1d0 + (long)pvVar46 * (long)iVar21);
                          iVar47 = 0;
                          do {
                            if (iVar19 < 4) {
                              uVar32 = 0;
                            }
                            else {
                              iVar22 = 3;
                              do {
                                *(char *)piVar27 = (char)*piVar29;
                                *(undefined1 *)((long)piVar27 + 1) =
                                     *(undefined1 *)((long)piVar29 + lVar30);
                                *(undefined1 *)((long)piVar27 + 2) =
                                     *(undefined1 *)((long)piVar29 + (long)(iVar41 * 2));
                                *(undefined1 *)((long)piVar27 + 3) =
                                     *(undefined1 *)((long)piVar29 + (long)(iVar41 * 3));
                                piVar29 = piVar29 + lVar30;
                                piVar27 = piVar27 + 1;
                                iVar22 = iVar22 + 4;
                                uVar32 = iVar19 & 0xfffffffc;
                              } while (iVar22 < iVar19);
                            }
                            uVar20 = uVar32 | 1;
                            while ((int)uVar20 < iVar19) {
                              *(char *)piVar27 = (char)*piVar29;
                              *(undefined1 *)((long)piVar27 + 1) =
                                   *(undefined1 *)((long)piVar29 + lVar30);
                              piVar29 = (pointer)((long)piVar29 + (long)(iVar41 * 2));
                              piVar27 = (pointer)((long)piVar27 + 2);
                              uVar20 = uVar32 + 3;
                              uVar32 = uVar32 + 2;
                            }
                            if ((int)uVar32 < iVar19) {
                              iVar22 = iVar19 - uVar32;
                              do {
                                *(char *)piVar27 = (char)*piVar29;
                                piVar29 = (pointer)((long)piVar29 + lVar30);
                                piVar27 = (pointer)((long)piVar27 + 1);
                                iVar22 = iVar22 + -1;
                              } while (iVar22 != 0);
                            }
                            piVar29 = (pointer)((long)piVar29 + (long)(iVar44 - iVar19 * iVar41));
                            iVar47 = iVar47 + 1;
                            puVar43 = local_198;
                          } while (iVar47 != (int)local_198);
                        }
                        pvVar46 = (void *)((long)pvVar46 + 1);
                      } while (pvVar46 != pvVar34);
                    }
                    pvVar46 = (void *)((long)local_1d8 + 1U);
                  } while ((void *)((long)local_1d8 + 1U) != local_1b0);
                }
                local_1a0 = local_1a0 + 1;
                local_1c8 = pvVar34;
              } while (local_1a0 != uVar40);
            }
            im2col_sgemm_int8_sse((Mat *)local_128,&local_d8,local_190,local_180);
            piVar1 = (int *)CONCAT44(local_128._12_4_,local_128._8_4_);
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                if ((Allocator *)local_108._0_8_ == (Allocator *)0x0) goto LAB_00230af3;
                (*(*(_func_int ***)local_108._0_8_)[3])();
              }
            }
          }
        }
      }
    }
LAB_00230981:
    p_Var2 = local_1a8->_vptr_Convolution_x86_avx[-3];
    if (local_7c < 0x65) {
      dequantize_from_int32
                (&local_d8,local_88,&local_1a8->scale_in_data,
                 (Mat *)(p_Var2 + 0x18 + (long)&(local_1a8->scale_in_data).data),local_180);
      pLVar3 = local_1a8->activation;
      iVar21 = 0;
      if (pLVar3 != (Layer *)0x0) {
        (*pLVar3->_vptr_Layer[9])(pLVar3,local_88,local_180);
      }
    }
    else {
      iVar21 = 0;
      requantize_from_int32_to_int8
                (&local_d8,local_88,&local_1a8->scale_in_data,
                 (Mat *)(&local_1a8->field_0x280 + (long)p_Var2),
                 (Mat *)(p_Var2 + 0x18 + (long)&(local_1a8->scale_in_data).data),
                 *(int *)(p_Var2 + 0x1c + (long)&(local_1a8->weight_winograd43_data).data),
                 (Mat *)(p_Var2 + 0x20 + (long)&(local_1a8->weight_winograd43_data).data),local_180)
      ;
    }
  }
  piVar1 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_d8.allocator == (Allocator *)0x0) {
        if (local_d8.data != (void *)0x0) {
          free(local_d8.data);
        }
      }
      else {
        (*(local_d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_00230a67:
  piVar1 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_178.allocator == (Allocator *)0x0) {
        if (local_178.data != (void *)0x0) {
          free(local_178.data);
        }
      }
      else {
        (*(local_178.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar21;
}

Assistant:

int Convolution_x86_avx::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
    }

    //     NCNN_LOGE("Convolution_arm input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_arm %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    int out_elempack_int32 = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack_int32, (size_t)(4u * out_elempack_int32), out_elempack_int32, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

#if __SSE2__
    if (elempack == 8 && out_elempack_int32 == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (elempack == 1 && out_elempack_int32 == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 7 && kernel_h == 7 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv7x7s2_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (elempack == 8 && out_elempack_int32 == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack_int32 == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd23_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd23_data, opt);
            // conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (use_int8_requantize)
    {
        requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
    }
    else
    {
        dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }

    return 0;
}